

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

int str2mc(char *s)

{
  int iVar1;
  char *in_RDI;
  int local_4;
  
  iVar1 = strcmp(in_RDI,"1.21");
  if (iVar1 == 0) {
    local_4 = 0x1c;
  }
  else {
    iVar1 = strcmp(in_RDI,"1.21 WD");
    if (iVar1 == 0) {
      local_4 = 0x1c;
    }
    else {
      iVar1 = strcmp(in_RDI,"1.21.3");
      if (iVar1 == 0) {
        local_4 = 0x1b;
      }
      else {
        iVar1 = strcmp(in_RDI,"1.21.2");
        if (iVar1 == 0) {
          local_4 = 0x1b;
        }
        else {
          iVar1 = strcmp(in_RDI,"1.21.1");
          if (iVar1 == 0) {
            local_4 = 0x1a;
          }
          else {
            iVar1 = strcmp(in_RDI,"1.20");
            if (iVar1 == 0) {
              local_4 = 0x19;
            }
            else {
              iVar1 = strcmp(in_RDI,"1.20.6");
              if (iVar1 == 0) {
                local_4 = 0x19;
              }
              else {
                iVar1 = strcmp(in_RDI,"1.19");
                if (iVar1 == 0) {
                  local_4 = 0x18;
                }
                else {
                  iVar1 = strcmp(in_RDI,"1.19.4");
                  if (iVar1 == 0) {
                    local_4 = 0x18;
                  }
                  else {
                    iVar1 = strcmp(in_RDI,"1.19.2");
                    if (iVar1 == 0) {
                      local_4 = 0x17;
                    }
                    else {
                      iVar1 = strcmp(in_RDI,"1.18");
                      if (iVar1 == 0) {
                        local_4 = 0x16;
                      }
                      else {
                        iVar1 = strcmp(in_RDI,"1.18.2");
                        if (iVar1 == 0) {
                          local_4 = 0x16;
                        }
                        else {
                          iVar1 = strcmp(in_RDI,"1.17");
                          if (iVar1 == 0) {
                            local_4 = 0x15;
                          }
                          else {
                            iVar1 = strcmp(in_RDI,"1.17.1");
                            if (iVar1 == 0) {
                              local_4 = 0x15;
                            }
                            else {
                              iVar1 = strcmp(in_RDI,"1.16");
                              if (iVar1 == 0) {
                                local_4 = 0x14;
                              }
                              else {
                                iVar1 = strcmp(in_RDI,"1.16.5");
                                if (iVar1 == 0) {
                                  local_4 = 0x14;
                                }
                                else {
                                  iVar1 = strcmp(in_RDI,"1.16.1");
                                  if (iVar1 == 0) {
                                    local_4 = 0x13;
                                  }
                                  else {
                                    iVar1 = strcmp(in_RDI,"1.15");
                                    if (iVar1 == 0) {
                                      local_4 = 0x12;
                                    }
                                    else {
                                      iVar1 = strcmp(in_RDI,"1.15.2");
                                      if (iVar1 == 0) {
                                        local_4 = 0x12;
                                      }
                                      else {
                                        iVar1 = strcmp(in_RDI,"1.14");
                                        if (iVar1 == 0) {
                                          local_4 = 0x11;
                                        }
                                        else {
                                          iVar1 = strcmp(in_RDI,"1.14.4");
                                          if (iVar1 == 0) {
                                            local_4 = 0x11;
                                          }
                                          else {
                                            iVar1 = strcmp(in_RDI,"1.13");
                                            if (iVar1 == 0) {
                                              local_4 = 0x10;
                                            }
                                            else {
                                              iVar1 = strcmp(in_RDI,"1.13.2");
                                              if (iVar1 == 0) {
                                                local_4 = 0x10;
                                              }
                                              else {
                                                iVar1 = strcmp(in_RDI,"1.12");
                                                if (iVar1 == 0) {
                                                  local_4 = 0xf;
                                                }
                                                else {
                                                  iVar1 = strcmp(in_RDI,"1.12.2");
                                                  if (iVar1 == 0) {
                                                    local_4 = 0xf;
                                                  }
                                                  else {
                                                    iVar1 = strcmp(in_RDI,"1.11");
                                                    if (iVar1 == 0) {
                                                      local_4 = 0xe;
                                                    }
                                                    else {
                                                      iVar1 = strcmp(in_RDI,"1.11.2");
                                                      if (iVar1 == 0) {
                                                        local_4 = 0xe;
                                                      }
                                                      else {
                                                        iVar1 = strcmp(in_RDI,"1.10");
                                                        if (iVar1 == 0) {
                                                          local_4 = 0xd;
                                                        }
                                                        else {
                                                          iVar1 = strcmp(in_RDI,"1.10.2");
                                                          if (iVar1 == 0) {
                                                            local_4 = 0xd;
                                                          }
                                                          else {
                                                            iVar1 = strcmp(in_RDI,"1.9");
                                                            if (iVar1 == 0) {
                                                              local_4 = 0xc;
                                                            }
                                                            else {
                                                              iVar1 = strcmp(in_RDI,"1.9.4");
                                                              if (iVar1 == 0) {
                                                                local_4 = 0xc;
                                                              }
                                                              else {
                                                                iVar1 = strcmp(in_RDI,"1.8");
                                                                if (iVar1 == 0) {
                                                                  local_4 = 0xb;
                                                                }
                                                                else {
                                                                  iVar1 = strcmp(in_RDI,"1.8.9");
                                                                  if (iVar1 == 0) {
                                                                    local_4 = 0xb;
                                                                  }
                                                                  else {
                                                                    iVar1 = strcmp(in_RDI,"1.7");
                                                                    if (iVar1 == 0) {
                                                                      local_4 = 10;
                                                                    }
                                                                    else {
                                                                      iVar1 = strcmp(in_RDI,"1.7.10"
                                                                                    );
                                                                      if (iVar1 == 0) {
                                                                        local_4 = 10;
                                                                      }
                                                                      else {
                                                                        iVar1 = strcmp(in_RDI,"1.6")
                                                                        ;
                                                                        if (iVar1 == 0) {
                                                                          local_4 = 9;
                                                                        }
                                                                        else {
                                                                          iVar1 = strcmp(in_RDI,
                                                  "1.6.4");
                                                  if (iVar1 == 0) {
                                                    local_4 = 9;
                                                  }
                                                  else {
                                                    iVar1 = strcmp(in_RDI,"1.5");
                                                    if (iVar1 == 0) {
                                                      local_4 = 8;
                                                    }
                                                    else {
                                                      iVar1 = strcmp(in_RDI,"1.5.2");
                                                      if (iVar1 == 0) {
                                                        local_4 = 8;
                                                      }
                                                      else {
                                                        iVar1 = strcmp(in_RDI,"1.4");
                                                        if (iVar1 == 0) {
                                                          local_4 = 7;
                                                        }
                                                        else {
                                                          iVar1 = strcmp(in_RDI,"1.4.7");
                                                          if (iVar1 == 0) {
                                                            local_4 = 7;
                                                          }
                                                          else {
                                                            iVar1 = strcmp(in_RDI,"1.3");
                                                            if (iVar1 == 0) {
                                                              local_4 = 6;
                                                            }
                                                            else {
                                                              iVar1 = strcmp(in_RDI,"1.3.2");
                                                              if (iVar1 == 0) {
                                                                local_4 = 6;
                                                              }
                                                              else {
                                                                iVar1 = strcmp(in_RDI,"1.2");
                                                                if (iVar1 == 0) {
                                                                  local_4 = 5;
                                                                }
                                                                else {
                                                                  iVar1 = strcmp(in_RDI,"1.2.5");
                                                                  if (iVar1 == 0) {
                                                                    local_4 = 5;
                                                                  }
                                                                  else {
                                                                    iVar1 = strcmp(in_RDI,"1.1");
                                                                    if (iVar1 == 0) {
                                                                      local_4 = 4;
                                                                    }
                                                                    else {
                                                                      iVar1 = strcmp(in_RDI,"1.1.0")
                                                                      ;
                                                                      if (iVar1 == 0) {
                                                                        local_4 = 4;
                                                                      }
                                                                      else {
                                                                        iVar1 = strcmp(in_RDI,"1.0")
                                                                        ;
                                                                        if (iVar1 == 0) {
                                                                          local_4 = 3;
                                                                        }
                                                                        else {
                                                                          iVar1 = strcmp(in_RDI,
                                                  "1.0.0");
                                                  if (iVar1 == 0) {
                                                    local_4 = 3;
                                                  }
                                                  else {
                                                    iVar1 = strcmp(in_RDI,"Beta 1.8");
                                                    if (iVar1 == 0) {
                                                      local_4 = 2;
                                                    }
                                                    else {
                                                      iVar1 = strcmp(in_RDI,"Beta 1.7");
                                                      if (iVar1 == 0) {
                                                        local_4 = 1;
                                                      }
                                                      else {
                                                        local_4 = 0;
                                                      }
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

int str2mc(const char *s)
{
    if (!strcmp(s, "1.21"))     return MC_1_21;
    if (!strcmp(s, "1.21 WD"))  return MC_1_21_WD;
    if (!strcmp(s, "1.21.3"))   return MC_1_21_3;
    if (!strcmp(s, "1.21.2"))   return MC_1_21_3; // backwards compatibility
    if (!strcmp(s, "1.21.1"))   return MC_1_21_1;
    if (!strcmp(s, "1.20"))     return MC_1_20;
    if (!strcmp(s, "1.20.6"))   return MC_1_20_6;
    if (!strcmp(s, "1.19"))     return MC_1_19;
    if (!strcmp(s, "1.19.4"))   return MC_1_19_4;
    if (!strcmp(s, "1.19.2"))   return MC_1_19_2;
    if (!strcmp(s, "1.18"))     return MC_1_18;
    if (!strcmp(s, "1.18.2"))   return MC_1_18_2;
    if (!strcmp(s, "1.17"))     return MC_1_17;
    if (!strcmp(s, "1.17.1"))   return MC_1_17_1;
    if (!strcmp(s, "1.16"))     return MC_1_16;
    if (!strcmp(s, "1.16.5"))   return MC_1_16_5;
    if (!strcmp(s, "1.16.1"))   return MC_1_16_1;
    if (!strcmp(s, "1.15"))     return MC_1_15;
    if (!strcmp(s, "1.15.2"))   return MC_1_15_2;
    if (!strcmp(s, "1.14"))     return MC_1_14;
    if (!strcmp(s, "1.14.4"))   return MC_1_14_4;
    if (!strcmp(s, "1.13"))     return MC_1_13;
    if (!strcmp(s, "1.13.2"))   return MC_1_13_2;
    if (!strcmp(s, "1.12"))     return MC_1_12;
    if (!strcmp(s, "1.12.2"))   return MC_1_12_2;
    if (!strcmp(s, "1.11"))     return MC_1_11;
    if (!strcmp(s, "1.11.2"))   return MC_1_11_2;
    if (!strcmp(s, "1.10"))     return MC_1_10;
    if (!strcmp(s, "1.10.2"))   return MC_1_10_2;
    if (!strcmp(s, "1.9"))      return MC_1_9;
    if (!strcmp(s, "1.9.4"))    return MC_1_9_4;
    if (!strcmp(s, "1.8"))      return MC_1_8;
    if (!strcmp(s, "1.8.9"))    return MC_1_8_9;
    if (!strcmp(s, "1.7"))      return MC_1_7;
    if (!strcmp(s, "1.7.10"))   return MC_1_7_10;
    if (!strcmp(s, "1.6"))      return MC_1_6;
    if (!strcmp(s, "1.6.4"))    return MC_1_6_4;
    if (!strcmp(s, "1.5"))      return MC_1_5;
    if (!strcmp(s, "1.5.2"))    return MC_1_5_2;
    if (!strcmp(s, "1.4"))      return MC_1_4;
    if (!strcmp(s, "1.4.7"))    return MC_1_4_7;
    if (!strcmp(s, "1.3"))      return MC_1_3;
    if (!strcmp(s, "1.3.2"))    return MC_1_3_2;
    if (!strcmp(s, "1.2"))      return MC_1_2;
    if (!strcmp(s, "1.2.5"))    return MC_1_2_5;
    if (!strcmp(s, "1.1"))      return MC_1_1;
    if (!strcmp(s, "1.1.0"))    return MC_1_1_0;
    if (!strcmp(s, "1.0"))      return MC_1_0;
    if (!strcmp(s, "1.0.0"))    return MC_1_0_0;
    if (!strcmp(s, "Beta 1.8")) return MC_B1_8;
    if (!strcmp(s, "Beta 1.7")) return MC_B1_7;
    return MC_UNDEF;
}